

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

State * __thiscall re2::DFA::CachedState(DFA *this,int *inst,int ninst,uint32_t flag)

{
  bool bVar1;
  reference ppSVar2;
  State *pSVar3;
  uint32_t in_ECX;
  int in_EDX;
  void *in_RSI;
  new_allocator<char> *in_RDI;
  int i;
  State *s;
  char *space;
  int mem;
  int nnext;
  int kStateCacheOverhead;
  iterator it;
  State state;
  __pointer_type in_stack_ffffffffffffff48;
  atomic<re2::DFA::State_*> *this_00;
  size_type in_stack_ffffffffffffff58;
  State *__x;
  int local_84;
  undefined1 local_61 [13];
  int local_54;
  int local_50;
  undefined4 local_4c;
  _Node_iterator_base<re2::DFA::State_*,_true> local_48;
  undefined1 *local_40;
  _Node_iterator_base<re2::DFA::State_*,_true> local_38;
  undefined1 local_30 [16];
  uint32_t local_20;
  int local_1c;
  void *local_18;
  State *local_8;
  
  local_40 = local_30;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
       ::find((unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
               *)in_stack_ffffffffffffff48,(key_type *)0x236c6c);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
       ::end((unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
              *)in_stack_ffffffffffffff48);
  bVar1 = std::__detail::operator!=(&local_38,&local_48);
  if (bVar1) {
    ppSVar2 = std::__detail::_Node_iterator<re2::DFA::State_*,_true,_true>::operator*
                        ((_Node_iterator<re2::DFA::State_*,_true,_true> *)0x236caf);
    local_8 = *ppSVar2;
  }
  else {
    local_4c = 0x28;
    local_50 = Prog::bytemap_range(*(Prog **)in_RDI);
    local_50 = local_50 + 1;
    local_54 = local_50 * 8 + 0x10 + local_1c * 4;
    if (*(long *)(in_RDI + 0xa0) < (long)(local_54 + 0x28)) {
      *(undefined8 *)(in_RDI + 0xa0) = 0xffffffffffffffff;
      local_8 = (State *)0x0;
    }
    else {
      *(long *)(in_RDI + 0xa0) = *(long *)(in_RDI + 0xa0) - (long)(local_54 + 0x28);
      this_00 = (atomic<re2::DFA::State_*> *)local_61;
      std::allocator<char>::allocator();
      pSVar3 = (State *)__gnu_cxx::new_allocator<char>::allocate
                                  (in_RDI,in_stack_ffffffffffffff58,this_00);
      std::allocator<char>::~allocator((allocator<char> *)local_61);
      __x = pSVar3;
      local_61._1_8_ = pSVar3;
      for (local_84 = 0; local_84 < local_50; local_84 = local_84 + 1) {
        std::atomic<re2::DFA::State_*>::atomic(this_00,in_stack_ffffffffffffff48);
      }
      pSVar3->inst_ = (int *)(&pSVar3[1].inst_ + local_50);
      memmove(pSVar3->inst_,local_18,(long)local_1c << 2);
      pSVar3->ninst_ = local_1c;
      pSVar3->flag_ = local_20;
      std::
      unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
      ::insert((unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                *)in_RDI,(value_type *)__x);
      local_8 = pSVar3;
    }
  }
  return local_8;
}

Assistant:

DFA::State* DFA::CachedState(int* inst, int ninst, uint32_t flag) {
  //mutex_.AssertHeld();

  // Look in the cache for a pre-existing state.
  // We have to initialise the struct like this because otherwise
  // MSVC will complain about the flexible array member. :(
  State state;
  state.inst_ = inst;
  state.ninst_ = ninst;
  state.flag_ = flag;
  StateSet::iterator it = state_cache_.find(&state);
  if (it != state_cache_.end()) {
    if (ExtraDebug)
      fprintf(stderr, " -cached-> %s\n", DumpState(*it).c_str());
    return *it;
  }

  // Must have enough memory for new state.
  // In addition to what we're going to allocate,
  // the state cache hash table seems to incur about 40 bytes per
  // State*, empirically.
  const int kStateCacheOverhead = 40;
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int mem = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
            ninst*sizeof(int);
  if (mem_budget_ < mem + kStateCacheOverhead) {
    mem_budget_ = -1;
    return NULL;
  }
  mem_budget_ -= mem + kStateCacheOverhead;

  // Allocate new state along with room for next_ and inst_.
  char* space = std::allocator<char>().allocate(mem);
  State* s = new (space) State;
  (void) new (s->next_) std::atomic<State*>[nnext];
  // Work around a unfortunate bug in older versions of libstdc++.
  // (https://gcc.gnu.org/bugzilla/show_bug.cgi?id=64658)
  for (int i = 0; i < nnext; i++)
    (void) new (s->next_ + i) std::atomic<State*>(NULL);
  s->inst_ = new (s->next_ + nnext) int[ninst];
  memmove(s->inst_, inst, ninst*sizeof s->inst_[0]);
  s->ninst_ = ninst;
  s->flag_ = flag;
  if (ExtraDebug)
    fprintf(stderr, " -> %s\n", DumpState(s).c_str());

  // Put state in cache and return it.
  state_cache_.insert(s);
  return s;
}